

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetFocusID(ImGuiID id,ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  ImVec2 *pIVar2;
  ImVec2 local_44;
  ImVec2 local_3c;
  ImRect local_34;
  ImGuiNavLayer local_24;
  ImGuiContext *pIStack_20;
  ImGuiNavLayer nav_layer;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  ImGuiID id_local;
  
  pIVar1 = GImGui;
  pIStack_20 = GImGui;
  g = (ImGuiContext *)window;
  window_local._4_4_ = id;
  if (id != 0) {
    local_24 = (window->DC).NavLayerCurrent;
    if (GImGui->NavWindow != window) {
      GImGui->NavInitRequest = false;
    }
    pIVar1->NavWindow = window;
    pIVar1->NavId = id;
    pIVar1->NavLayer = local_24;
    pIVar1->NavFocusScopeId = (window->DC).NavFocusScopeIdCurrent;
    window->NavLastIds[local_24] = id;
    if ((window->DC).LastItemId == id) {
      local_3c = operator-(&(window->DC).LastItemRect.Min,&window->Pos);
      local_44 = operator-((ImVec2 *)((long)&(g->IO).ImeWindowHandle + 4),&(g->IO).DisplaySize);
      ImRect::ImRect(&local_34,&local_3c,&local_44);
      pIVar2 = (ImVec2 *)((g->IO).NavInputs + (ulong)local_24 * 4 + 0x11);
      *pIVar2 = local_34.Min;
      pIVar2[1] = local_34.Max;
    }
    if (pIStack_20->ActiveIdSource == ImGuiInputSource_Nav) {
      pIStack_20->NavDisableMouseHover = true;
    }
    else {
      pIStack_20->NavDisableHighlight = true;
    }
    return;
  }
  __assert_fail("id != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                ,0x1f0c,"void ImGui::SetFocusID(ImGuiID, ImGuiWindow *)");
}

Assistant:

void ImGui::SetFocusID(ImGuiID id, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0);

    // Assume that SetFocusID() is called in the context where its window->DC.NavLayerCurrent and window->DC.NavFocusScopeIdCurrent are valid.
    // Note that window may be != g.CurrentWindow (e.g. SetFocusID call in InputTextEx for multi-line text)
    const ImGuiNavLayer nav_layer = window->DC.NavLayerCurrent;
    if (g.NavWindow != window)
        g.NavInitRequest = false;
    g.NavWindow = window;
    g.NavId = id;
    g.NavLayer = nav_layer;
    g.NavFocusScopeId = window->DC.NavFocusScopeIdCurrent;
    window->NavLastIds[nav_layer] = id;
    if (window->DC.LastItemId == id)
        window->NavRectRel[nav_layer] = ImRect(window->DC.LastItemRect.Min - window->Pos, window->DC.LastItemRect.Max - window->Pos);

    if (g.ActiveIdSource == ImGuiInputSource_Nav)
        g.NavDisableMouseHover = true;
    else
        g.NavDisableHighlight = true;
}